

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

const_reference __thiscall
absl::lts_20240722::
InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
::operator[](InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
             *this,size_type i)

{
  ulong uVar1;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pPVar2;
  
  uVar1 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<std::allocator<absl::lts_20240722::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (i < uVar1 >> 1) {
    if ((uVar1 & 1) == 0) {
      pPVar2 = (Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>)
               &(this->storage_).data_;
    }
    else {
      pPVar2 = (this->storage_).data_.allocated.allocated_data;
    }
    return pPVar2 + i;
  }
  InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>
  ::operator[]();
  __cxa_begin_catch();
  std::terminate();
}

Assistant:

SizeType<A> GetSize() const { return GetSizeAndIsAllocated() >> 1; }